

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QList<QTzType> *
parseTzIndicators(QList<QTzType> *__return_storage_ptr__,QDataStream *ds,QList<QTzType> *types,
                 int tzh_ttisstdcnt,int tzh_ttisgmtcnt)

{
  Data *pDVar1;
  Status SVar2;
  long in_FS_OFFSET;
  bool temp;
  bool local_31;
  QList<QTzType> *local_30;
  
  local_30 = *(QList<QTzType> **)(in_FS_OFFSET + 0x28);
  pDVar1 = (types->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (types->d).ptr;
  (__return_storage_ptr__->d).size = (types->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_31 = true;
  if (0 < tzh_ttisstdcnt) {
    do {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      QDataStream::operator>>(ds,&local_31);
      tzh_ttisstdcnt = tzh_ttisstdcnt + -1;
    } while (tzh_ttisstdcnt != 0);
  }
  if (0 < tzh_ttisgmtcnt) {
    do {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      QDataStream::operator>>(ds,&local_31);
      tzh_ttisgmtcnt = tzh_ttisgmtcnt + -1;
    } while (tzh_ttisgmtcnt != 0);
  }
  if (*(QList<QTzType> **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(QList<QTzType> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QList<QTzType> parseTzIndicators(QDataStream &ds, const QList<QTzType> &types, int tzh_ttisstdcnt,
                                        int tzh_ttisgmtcnt)
{
    QList<QTzType> result = types;
    bool temp;
    /*
      Scan and discard indicators.

      These indicators are only of use (by the date program) when "handling
      POSIX-style time zone environment variables".  The flags here say whether
      the *specification* of the zone gave the time in UTC, local standard time
      or local wall time; but whatever was specified has been digested for us,
      already, by the zone-info compiler (zic), so that the tz_time values read
      from the file (by parseTzTransitions) are all in UTC.
     */

    // Scan tzh_ttisstdcnt x 1-byte standard/wall indicators
    for (int i = 0; i < tzh_ttisstdcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    // Scan tzh_ttisgmtcnt x 1-byte UTC/local indicators
    for (int i = 0; i < tzh_ttisgmtcnt && ds.status() == QDataStream::Ok; ++i)
        ds >> temp;

    return result;
}